

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O3

bool __thiscall
rapidjson::
GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
::Null(GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
       *this)

{
  bool bVar1;
  char *pcVar2;
  unsigned_long *puVar3;
  ulong uVar4;
  
  if (this->valid_ != true) {
    return false;
  }
  bVar1 = BeginValue(this);
  if ((bVar1) || ((this->flags_ & 1) != 0)) {
    pcVar2 = (this->schemaStack_).stackTop_;
    if ((ulong)((long)pcVar2 - (long)(this->schemaStack_).stack_) < 0x90) {
      __assert_fail("GetSize() >= sizeof(T)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/internal/stack.h"
                    ,0x98,
                    "const T *rapidjson::internal::Stack<rapidjson::CrtAllocator>::Top() const [Allocator = rapidjson::CrtAllocator, T = rapidjson::internal::SchemaValidationContext<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<>>>>]"
                   );
    }
    bVar1 = internal::
            Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
            ::Null(*(Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
                     **)(pcVar2 + -0x80),(Context *)(pcVar2 + -0x90));
    if ((!bVar1) && ((this->flags_ & 1) == 0)) goto LAB_0012bd4a;
    pcVar2 = (this->schemaStack_).stack_;
    if (pcVar2 != (this->schemaStack_).stackTop_) {
      do {
        if (*(Stack<rapidjson::CrtAllocator> **)(pcVar2 + 0x38) !=
            (Stack<rapidjson::CrtAllocator> *)0x0) {
          puVar3 = internal::Stack<rapidjson::CrtAllocator>::Push<unsigned_long>
                             (*(Stack<rapidjson::CrtAllocator> **)(pcVar2 + 0x38),1);
          *puVar3 = 0xaf63bd4c8601b7df;
        }
        if ((*(long *)(pcVar2 + 0x48) != 0) && (*(int *)(pcVar2 + 0x50) != 0)) {
          uVar4 = 0;
          do {
            Null((GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
                  *)(*(long *)(*(long *)(pcVar2 + 0x48) + uVar4 * 8) + -8));
            uVar4 = uVar4 + 1;
          } while (uVar4 < *(uint *)(pcVar2 + 0x50));
        }
        if ((*(long *)(pcVar2 + 0x58) != 0) && (*(int *)(pcVar2 + 0x60) != 0)) {
          uVar4 = 0;
          do {
            Null((GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
                  *)(*(long *)(*(long *)(pcVar2 + 0x58) + uVar4 * 8) + -8));
            uVar4 = uVar4 + 1;
          } while (uVar4 < *(uint *)(pcVar2 + 0x60));
        }
        pcVar2 = pcVar2 + 0x90;
      } while (pcVar2 != (this->schemaStack_).stackTop_);
    }
    bVar1 = EndValue(this);
    if ((bVar1) || ((this->flags_ & 1) != 0)) {
      bVar1 = true;
      goto LAB_0012be34;
    }
  }
  else {
LAB_0012bd4a:
    pcVar2 = internal::Stack<rapidjson::CrtAllocator>::Push<char>(&this->documentStack_,1);
    *pcVar2 = '\0';
    pcVar2 = (this->documentStack_).stackTop_;
    if (pcVar2 == (this->documentStack_).stack_) {
      __assert_fail("GetSize() >= count * sizeof(T)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/internal/stack.h"
                    ,0x8b,
                    "T *rapidjson::internal::Stack<rapidjson::CrtAllocator>::Pop(size_t) [Allocator = rapidjson::CrtAllocator, T = char]"
                   );
    }
    (this->documentStack_).stackTop_ = pcVar2 + -1;
  }
  bVar1 = false;
LAB_0012be34:
  this->valid_ = bVar1;
  return bVar1;
}

Assistant:

bool Null()             { RAPIDJSON_SCHEMA_HANDLE_VALUE_(Null,   (CurrentContext()), ( )); }